

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O0

int rdacc_den(char *dir,vector_t ****inout_wt_mean,vector_t ****inout_wt_var,int32 *inout_pass2var,
             float32 ****inout_dnom,uint32 *inout_n_mgau,uint32 *inout_n_stream,
             uint32 *inout_n_density,uint32 **inout_veclen)

{
  int iVar1;
  char *out_n_feat;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32 *puStack_1098;
  int err;
  uint32 *in_veclen;
  int32 local_1088;
  int i;
  int32 pass2var;
  uint32 n_density;
  uint32 n_stream;
  uint32 n_mgau;
  float32 ***dnom;
  float32 ***in_dnom;
  vector_t ***wt_var;
  vector_t ***in_wt_var;
  vector_t ***wt_mean;
  vector_t ***in_wt_mean;
  char fn [4097];
  uint32 *inout_n_mgau_local;
  float32 ****inout_dnom_local;
  int32 *inout_pass2var_local;
  vector_t ****inout_wt_var_local;
  vector_t ****inout_wt_mean_local;
  char *dir_local;
  
  unique0x100002d1 = inout_n_mgau;
  sprintf((char *)&in_wt_mean,"%s/gauden_counts",dir);
  out_n_feat = (char *)&pass2var;
  iVar1 = s3gaucnt_read((char *)&in_wt_mean,&wt_mean,&wt_var,&local_1088,&dnom,&n_density,
                        (uint32 *)out_n_feat,(uint32 *)&i,&stack0xffffffffffffef68);
  if (iVar1 == 0) {
    in_wt_var = *inout_wt_mean;
    in_dnom = (float32 ***)*inout_wt_var;
    _n_stream = *inout_dnom;
    if (in_wt_var == (vector_t ***)0x0) {
      *inout_wt_mean = wt_mean;
      *inout_dnom = dnom;
      *stack0xffffffffffffffc0 = n_density;
      *inout_n_stream = pass2var;
      *inout_n_density = i;
      *inout_veclen = puStack_1098;
      *inout_pass2var = local_1088;
      if (((vector_t ***)in_dnom == (vector_t ***)0x0) && (wt_var != (vector_t ***)0x0)) {
        *inout_wt_var = wt_var;
      }
    }
    else {
      bVar3 = *stack0xffffffffffffffc0 != n_density;
      if (bVar3) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),*stack0xffffffffffffffc0);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0xf3,"# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",&in_wt_mean,
                (ulong)n_density,out_n_feat);
      }
      bVar4 = *inout_n_stream != pass2var;
      if (bVar4) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),*inout_n_stream);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0xfa,"# stream for file %s (== %u) != prior # stream (== %u)\n",&in_wt_mean,
                (ulong)(uint)pass2var,out_n_feat);
      }
      bVar5 = *inout_n_density != i;
      if (bVar5) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),*inout_n_density);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x101,"# density comp/mix for file %s (== %u) != prior # density, %u\n",&in_wt_mean
                ,(ulong)(uint)i,out_n_feat);
      }
      bVar5 = bVar5 || (bVar4 || bVar3);
      if (*inout_pass2var != local_1088) {
        pcVar2 = "false";
        if (local_1088 != 0) {
          pcVar2 = "true";
        }
        out_n_feat = "false";
        if (*inout_pass2var != 0) {
          out_n_feat = "true";
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x108,"2 pass var %s in %s, but %s in others.\n",&in_wt_mean,pcVar2,out_n_feat);
        bVar5 = true;
      }
      for (in_veclen._4_4_ = 0; in_veclen._4_4_ < (uint)pass2var;
          in_veclen._4_4_ = in_veclen._4_4_ + 1) {
        if ((*inout_veclen)[(int)in_veclen._4_4_] != puStack_1098[(int)in_veclen._4_4_]) {
          out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),
                                        (*inout_veclen)[(int)in_veclen._4_4_]);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                  ,0x110,"vector length of stream %u (== %u) != prior length (== %u)\n",
                  (ulong)in_veclen._4_4_,(ulong)puStack_1098[(int)in_veclen._4_4_],out_n_feat);
          bVar5 = true;
        }
      }
      ckd_free(puStack_1098);
      if (bVar5) {
        return -1;
      }
      accum_3d(_n_stream,dnom,n_density,pass2var,i);
      gauden_accum_param(in_wt_var,wt_mean,n_density,pass2var,i,*inout_veclen);
      gauden_free_param(wt_mean);
      if (in_dnom != (float32 ***)0x0) {
        if (wt_var == (vector_t ***)0x0) {
          __assert_fail("in_wt_var",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                        ,0x122,
                        "int rdacc_den(const char *, vector_t ****, vector_t ****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                       );
        }
        gauden_accum_param((vector_t ***)in_dnom,wt_var,n_density,pass2var,i,*inout_veclen);
        gauden_free_param(wt_var);
      }
    }
    dir_local._4_4_ = 0;
  }
  else {
    fflush(_stdout);
    perror((char *)&in_wt_mean);
    dir_local._4_4_ = -1;
  }
  return dir_local._4_4_;
}

Assistant:

int
rdacc_den(const char *dir,
          vector_t **** inout_wt_mean,
          vector_t **** inout_wt_var,
          int32 * inout_pass2var,
          float32 **** inout_dnom,
          uint32 * inout_n_mgau,
          uint32 * inout_n_stream,
          uint32 * inout_n_density, uint32 ** inout_veclen)
{
    char fn[MAXPATHLEN + 1];
    vector_t ***in_wt_mean;
    vector_t ***wt_mean;
    vector_t ***in_wt_var;
    vector_t ***wt_var;
    float32 ***in_dnom;
    float32 ***dnom;
    uint32 n_mgau;
    uint32 n_stream;
    uint32 n_density;
    int32 pass2var;
    int i;

    uint32 *in_veclen;

    sprintf(fn, "%s/gauden_counts", dir);

    if (s3gaucnt_read(fn,
                      &in_wt_mean,
                      &in_wt_var,
                      &pass2var,
                      &in_dnom,
                      &n_mgau,
                      &n_stream, &n_density, &in_veclen) != S3_SUCCESS) {
        fflush(stdout);
        perror(fn);

        return S3_ERROR;
    }

    wt_mean = *inout_wt_mean;
    wt_var = *inout_wt_var;
    dnom = *inout_dnom;

    if (wt_mean == NULL) {

        /* if a gauden_counts file exists, it will have reestimated means */

        *inout_wt_mean = wt_mean = in_wt_mean;
        *inout_dnom = dnom = in_dnom;
        *inout_n_mgau = n_mgau;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
        *inout_veclen = in_veclen;
        *inout_pass2var = pass2var;

        if (wt_var == NULL && in_wt_var != NULL) {
            *inout_wt_var = wt_var = in_wt_var;
        }
    }
    else {
        int err = FALSE;

        /* check if matrices are able to be added */
        if (*inout_n_mgau != n_mgau) {
            E_ERROR
                ("# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",
                 fn, n_mgau, *inout_n_mgau);
            err = TRUE;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream for file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            err = TRUE;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix for file %s (== %u) != prior # density, %u\n",
                 fn, n_density, *inout_n_density);
            err = TRUE;
        }

        if (*inout_pass2var != pass2var) {
            E_ERROR("2 pass var %s in %s, but %s in others.\n",
                    fn, (pass2var ? "true" : "false"),
                    (*inout_pass2var ? "true" : "false"));
            err = TRUE;
        }

        for (i = 0; i < n_stream; i++) {
            if ((*inout_veclen)[i] != in_veclen[i]) {
                E_ERROR
                    ("vector length of stream %u (== %u) != prior length (== %u)\n",
                     i, in_veclen[i], (*inout_veclen)[i]);
                err = TRUE;
            }
        }

        ckd_free(in_veclen);

        if (err)
            return S3_ERROR;

        /* accumulate values */
        accum_3d(dnom, in_dnom, n_mgau, n_stream, n_density);

        gauden_accum_param(wt_mean, in_wt_mean,
                           n_mgau, n_stream, n_density, *inout_veclen);
        gauden_free_param(in_wt_mean);

        if (wt_var) {
            assert(in_wt_var);

            gauden_accum_param(wt_var, in_wt_var,
                               n_mgau, n_stream, n_density, *inout_veclen);
            gauden_free_param(in_wt_var);
        }
    }

    return S3_SUCCESS;
}